

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void acvf2acf(double *acorr,int M)

{
  double dVar1;
  long lVar2;
  
  dVar1 = *acorr;
  *acorr = 1.0;
  for (lVar2 = 1; lVar2 < M; lVar2 = lVar2 + 1) {
    acorr[lVar2] = acorr[lVar2] / dVar1;
  }
  return;
}

Assistant:

void acvf2acf(double *acorr, int M) {
	// Converts Autocovariance to autocorrelation function
	int i;
	double var;

	var = acorr[0];
	acorr[0] = 1.0;

	for (i = 1; i < M; i++) {
		acorr[i] = acorr[i] / var;
	}
}